

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void rtc::LogMessage::RemoveLogToStream(LogSink *stream)

{
  const_iterator __position;
  CritScope cs;
  CritScope local_10;
  
  CritScope::CritScope(&local_10,(CriticalSection *)(anonymous_namespace)::g_log_crit);
  __position._M_node = (_List_node_base *)&streams__abi_cxx11_;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)&streams__abi_cxx11_) goto LAB_001464c3;
  } while (__position._M_node[1]._M_next != (_List_node_base *)stream);
  std::__cxx11::
  list<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>,_std::allocator<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>_>_>
  ::erase((list<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>,_std::allocator<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>_>_>
           *)&streams__abi_cxx11_,__position);
LAB_001464c3:
  UpdateMinLogSeverity();
  CritScope::~CritScope(&local_10);
  return;
}

Assistant:

void LogMessage::RemoveLogToStream(LogSink* stream) {
  CritScope cs(&g_log_crit);
  for (StreamList::iterator it = streams_.begin(); it != streams_.end(); ++it) {
    if (stream == it->first) {
      streams_.erase(it);
      break;
    }
  }
  UpdateMinLogSeverity();
}